

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::DirectStateAccess::Buffers::ClearTest::Compare<float>
          (ClearTest *this,GLfloat *data,GLfloat *reference,GLsizei count)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  
  bVar3 = count < 1;
  if (0 < count) {
    fVar4 = *data - *reference;
    fVar5 = -fVar4;
    if (-fVar4 <= fVar4) {
      fVar5 = fVar4;
    }
    if (fVar5 <= 1e-05) {
      uVar1 = 1;
      do {
        uVar2 = uVar1;
        if ((uint)count == uVar2) break;
        fVar4 = data[uVar2] - reference[uVar2];
        fVar5 = -fVar4;
        if (-fVar4 <= fVar4) {
          fVar5 = fVar4;
        }
        uVar1 = uVar2 + 1;
      } while (fVar5 <= 1e-05);
      bVar3 = (uint)count <= uVar2;
    }
  }
  return bVar3;
}

Assistant:

bool ClearTest::Compare<glw::GLfloat>(const glw::GLfloat* data, const glw::GLfloat* reference, const glw::GLsizei count)
{
	for (glw::GLsizei i = 0; i < count; ++i)
	{
		if (de::abs(data[i] - reference[i]) > 0.00001 /* Precision. */)
		{
			return false;
		}
	}
	return true;
}